

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O2

bool pvmath::parallelLine<double>(void)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 in_XMM8_Qb;
  PointBase2D<double> point2;
  PointBase2D<double> point1;
  LineBase2D<double> line2;
  LineBase2D<double> line1;
  PointBase2D<double> local_b0;
  PointBase2D<double> local_a0;
  PointBase2D<double> local_90;
  PointBase2D<double> local_80;
  LineBase2D<double> local_70;
  LineBase2D<double> local_50;
  
  uVar2 = 0;
  do {
    uVar6 = uVar2;
    uVar4 = Test_Helper::runCount();
    if (uVar4 <= uVar6) break;
    iVar5 = rand();
    auVar12._0_8_ = (double)(iVar5 % 200000);
    auVar12._8_8_ = in_XMM8_Qb;
    auVar10 = vfmadd213sd_fma(auVar12,ZEXT816(0x3f847ae140000000),ZEXT816(0xc08f400000000000));
    iVar5 = rand();
    auVar7._0_8_ = (double)(iVar5 % 200000);
    auVar7._8_8_ = in_XMM8_Qb;
    auVar7 = vfmadd213sd_fma(auVar7,ZEXT816(0x3f847ae140000000),ZEXT816(0xc08f400000000000));
    local_a0.y = auVar7._0_8_;
    local_a0.x = auVar10._0_8_;
    iVar5 = rand();
    auVar10._0_8_ = (double)(iVar5 % 200000);
    auVar10._8_8_ = in_XMM8_Qb;
    auVar10 = vfmadd213sd_fma(auVar10,ZEXT816(0x3f847ae140000000),ZEXT816(0xc08f400000000000));
    iVar5 = rand();
    auVar8._0_8_ = (double)(iVar5 % 200000);
    auVar8._8_8_ = in_XMM8_Qb;
    auVar7 = vfmadd213sd_fma(auVar8,ZEXT816(0x3f847ae140000000),ZEXT816(0xc08f400000000000));
    local_b0.y = auVar7._0_8_;
    local_b0.x = auVar10._0_8_;
    LineBase2D<double>::LineBase2D(&local_50,&local_a0,&local_b0);
    iVar5 = rand();
    auVar11._0_8_ = (double)(iVar5 % 200000);
    auVar11._8_8_ = in_XMM8_Qb;
    auVar10 = vfmadd213sd_fma(auVar11,ZEXT816(0x3f847ae140000000),ZEXT816(0xc08f400000000000));
    iVar5 = rand();
    auVar9._0_8_ = (double)(iVar5 % 200000);
    auVar9._8_8_ = in_XMM8_Qb;
    auVar7 = vfmadd213sd_fma(auVar9,ZEXT816(0x3f847ae140000000),ZEXT816(0xc08f400000000000));
    bVar1 = (byte)uVar6;
    local_80.x = auVar10._0_8_ +
                 (double)((ulong)(bVar1 & 1) * (long)local_b0.x +
                         (ulong)!(bool)(bVar1 & 1) * (long)local_a0.x);
    local_80.y = auVar7._0_8_ +
                 (double)((ulong)(bVar1 & 1) * (long)local_b0.y +
                         (ulong)!(bool)(bVar1 & 1) * (long)local_a0.y);
    local_90.x = auVar10._0_8_ +
                 (double)((ulong)(bVar1 & 1) * (long)local_a0.x +
                         (ulong)!(bool)(bVar1 & 1) * (long)local_b0.x);
    local_90.y = auVar7._0_8_ +
                 (double)((ulong)(bVar1 & 1) * (long)local_a0.y +
                         (ulong)!(bool)(bVar1 & 1) * (long)local_b0.y);
    LineBase2D<double>::LineBase2D(&local_70,&local_80,&local_90);
    bVar3 = LineBase2D<double>::isParallel(&local_50,&local_70);
    uVar2 = uVar6 + 1;
  } while (bVar3);
  return uVar4 <= uVar6;
}

Assistant:

bool parallelLine()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const PointBase2D<_Type> point1( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const PointBase2D<_Type> point2( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const LineBase2D<_Type> line1( point1, point2 );

            const PointBase2D<_Type> offset( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const bool inverse = ( (i % 2) == 0 );
            const LineBase2D<_Type> line2( (inverse ? point1 : point2) + offset, (inverse ? point2 : point1) + offset );
            if ( !line1.isParallel( line2 ) )
                return false;
        }
        return true;
    }